

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

IResultCapture * Catch::getResultCapture(void)

{
  IResultCapture *pIVar1;
  string local_50;
  ReusableStringStream local_30;
  SourceLineInfo local_18;
  
  if (IMutableContext::currentContext == (long *)0x0) {
    IMutableContext::currentContext = (long *)operator_new(0x30);
    *IMutableContext::currentContext = 0;
    IMutableContext::currentContext[1] = 0;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
    *IMutableContext::currentContext = (long)&PTR__Context_00182f10;
    IMutableContext::currentContext[1] = (long)&PTR__Context_00182f60;
  }
  pIVar1 = (IResultCapture *)(**(code **)(*IMutableContext::currentContext + 0x10))();
  if (pIVar1 != (IResultCapture *)0x0) {
    return pIVar1;
  }
  ReusableStringStream::ReusableStringStream(&local_30);
  local_18.file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Toxe[P]catch2-examples/src/single_header/single_test_file_multiple_sources/include/catch2/catch.hpp"
  ;
  local_18.line = 0x3358;
  operator<<(local_30.m_oss,&local_18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_30.m_oss,": Internal Catch2 error: ",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_30.m_oss,"No result capture instance",0x1a);
  std::__cxx11::stringbuf::str();
  throw_logic_error(&local_50);
}

Assistant:

inline IMutableContext& getCurrentMutableContext()
    {
        if( !IMutableContext::currentContext )
            IMutableContext::createContext();
        // NOLINTNEXTLINE(clang-analyzer-core.uninitialized.UndefReturn)
        return *IMutableContext::currentContext;
    }